

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IDisk.cpp
# Opt level: O2

int IDisk::CompareForSync(uchar *src,uchar *src2,int size)

{
  uchar *puVar1;
  uchar *puVar2;
  long lVar3;
  int i;
  ulong uVar4;
  
  lVar3 = 1;
  do {
    if (size <= lVar3) {
      return 0;
    }
    puVar1 = src + lVar3;
    puVar2 = src2 + lVar3;
    lVar3 = lVar3 + 2;
  } while (*puVar1 == *puVar2);
  uVar4 = 1;
  while( true ) {
    if ((long)size <= (long)uVar4) {
      return 1;
    }
    if ((src[uVar4] != src2[uVar4 - 1]) && ((1 < uVar4 || (src2[uVar4] == '\x01')))) break;
    uVar4 = uVar4 + 2;
  }
  return -1;
}

Assistant:

int IDisk::CompareForSync(unsigned char* src, unsigned char* src2, int size)
{
   int found = 0;

   // Src is from unsafe source : It can be :
   // - Shiffted
   // - incomplete (only one bit every 2 MFM bit is stored - It can be data or clock bit)
   for (int i = 1; i < size; i += 2)
   {
      // Add this : 10 == 00
      // Only check data bit (no clock bit)
      if (src[i] != src2[i])
      {
         found = -1;
         break;
      }
   }

   if (found == 0)
      return found;

   found = 1;
   for (int i = 1; i < size; i += 2)
   {
      // Now, check clock bit (maybe it's the one that is stored)
      if ((src[i] != src2[i - 1]) && (i > 1 || src2[i] == 1))
      {
         found = -1;
         break;
      }
   }
   return found;
}